

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_props.cpp
# Opt level: O0

UnicodeSet * __thiscall
icu_63::UnicodeSet::applyPropertyAlias
          (UnicodeSet *this,UnicodeString *prop,UnicodeString *value,UErrorCode *ec)

{
  UProperty property;
  UBool UVar1;
  int32_t iVar2;
  UChar32 c;
  char16_t *pcVar3;
  char *pcVar4;
  UnicodeSet *pUVar5;
  uint8_t local_20c [4];
  char local_208 [4];
  UVersionInfo version;
  char buf_1 [128];
  char local_178 [4];
  UChar32 ch;
  char buf [128];
  double local_f0;
  double val_1;
  char *end_1;
  double val;
  char *end;
  int32_t local_c8;
  UProperty UStack_c4;
  UBool invert;
  int32_t v;
  UProperty p;
  undefined1 local_b0 [8];
  CharString vname;
  CharString pname;
  UErrorCode *ec_local;
  UnicodeString *value_local;
  UnicodeString *prop_local;
  UnicodeSet *this_local;
  
  UVar1 = ::U_FAILURE(*ec);
  if (UVar1 != '\0') {
    return this;
  }
  UVar1 = isFrozen(this);
  if (UVar1 != '\0') {
    return this;
  }
  pcVar3 = UnicodeString::getBuffer(prop);
  iVar2 = UnicodeString::length(prop);
  UVar1 = uprv_isInvariantUString_63(pcVar3,iVar2);
  if (UVar1 == '\0') {
LAB_0039552b:
    *ec = U_ILLEGAL_ARGUMENT_ERROR;
    return this;
  }
  pcVar3 = UnicodeString::getBuffer(value);
  iVar2 = UnicodeString::length(value);
  UVar1 = uprv_isInvariantUString_63(pcVar3,iVar2);
  if (UVar1 == '\0') goto LAB_0039552b;
  CharString::CharString((CharString *)&vname.len);
  CharString::CharString((CharString *)local_b0);
  CharString::appendInvariantChars((CharString *)&vname.len,prop,ec);
  CharString::appendInvariantChars((CharString *)local_b0,value,ec);
  UVar1 = ::U_FAILURE(*ec);
  if (UVar1 != '\0') goto LAB_00395ee9;
  end._7_1_ = '\0';
  iVar2 = UnicodeString::length(value);
  if (iVar2 < 1) {
    UStack_c4 = UCHAR_GENERAL_CATEGORY_MASK;
    pcVar4 = CharString::data((CharString *)&vname.len);
    local_c8 = u_getPropertyValueEnum_63(UCHAR_GENERAL_CATEGORY_MASK,pcVar4);
    if (local_c8 == -1) {
      UStack_c4 = UCHAR_SCRIPT;
      pcVar4 = CharString::data((CharString *)&vname.len);
      local_c8 = u_getPropertyValueEnum_63(UCHAR_SCRIPT,pcVar4);
      if (local_c8 == -1) {
        pcVar4 = CharString::data((CharString *)&vname.len);
        UStack_c4 = u_getPropertyEnum_63(pcVar4);
        if ((UStack_c4 < UCHAR_ALPHABETIC) || (UCHAR_EXTENDED_PICTOGRAPHIC < UStack_c4)) {
          pcVar4 = CharString::data((CharString *)&vname.len);
          iVar2 = uprv_compareASCIIPropertyNames_63("ANY",pcVar4);
          if (iVar2 == 0) {
            set(this,0,0x10ffff);
            goto LAB_00395ee9;
          }
          pcVar4 = CharString::data((CharString *)&vname.len);
          iVar2 = uprv_compareASCIIPropertyNames_63("ASCII",pcVar4);
          if (iVar2 == 0) {
            set(this,0,0x7f);
            goto LAB_00395ee9;
          }
          pcVar4 = CharString::data((CharString *)&vname.len);
          iVar2 = uprv_compareASCIIPropertyNames_63("Assigned",pcVar4);
          if (iVar2 != 0) {
            *ec = U_ILLEGAL_ARGUMENT_ERROR;
            goto LAB_00395ee9;
          }
          UStack_c4 = UCHAR_GENERAL_CATEGORY_MASK;
          end._7_1_ = '\x01';
        }
        local_c8 = 1;
      }
    }
  }
  else {
    pcVar4 = CharString::data((CharString *)&vname.len);
    UStack_c4 = u_getPropertyEnum_63(pcVar4);
    if (UStack_c4 == UCHAR_INVALID_CODE) {
      *ec = U_ILLEGAL_ARGUMENT_ERROR;
      goto LAB_00395ee9;
    }
    if (UStack_c4 == UCHAR_GENERAL_CATEGORY) {
      UStack_c4 = UCHAR_GENERAL_CATEGORY_MASK;
    }
    property = UStack_c4;
    if ((((UStack_c4 < UCHAR_ALPHABETIC) || (UCHAR_EXTENDED_PICTOGRAPHIC < UStack_c4)) &&
        ((UStack_c4 < UCHAR_BIDI_CLASS || (UCHAR_VERTICAL_ORIENTATION < UStack_c4)))) &&
       ((UStack_c4 < UCHAR_GENERAL_CATEGORY_MASK || (UCHAR_GENERAL_CATEGORY_MASK < UStack_c4)))) {
      if (UStack_c4 == UCHAR_DOUBLE_START) {
        pcVar4 = CharString::data((CharString *)local_b0);
        local_f0 = strtod(pcVar4,(char **)&val_1);
        if (*(char *)val_1 == '\0') {
          pUVar5 = CharacterProperties::getInclusionsForProperty(UStack_c4,ec);
          applyFilter(this,anon_unknown_0::numericValueFilter,&local_f0,pUVar5,ec);
        }
        else {
          *ec = U_ILLEGAL_ARGUMENT_ERROR;
        }
        goto LAB_00395ee9;
      }
      if (UStack_c4 == UCHAR_AGE) {
        pcVar4 = CharString::data((CharString *)local_b0);
        UVar1 = anon_unknown_0::mungeCharName(local_208,pcVar4,0x80);
        if (UVar1 == '\0') {
          *ec = U_ILLEGAL_ARGUMENT_ERROR;
        }
        else {
          u_versionFromString_63(local_20c,local_208);
          pUVar5 = CharacterProperties::getInclusionsForProperty(UStack_c4,ec);
          applyFilter(this,anon_unknown_0::versionFilter,local_20c,pUVar5,ec);
        }
        goto LAB_00395ee9;
      }
      if (UStack_c4 == UCHAR_NAME) {
        pcVar4 = CharString::data((CharString *)local_b0);
        UVar1 = anon_unknown_0::mungeCharName(local_178,pcVar4,0x80);
        if (UVar1 == '\0') {
          *ec = U_ILLEGAL_ARGUMENT_ERROR;
        }
        else {
          c = u_charFromName_63(U_EXTENDED_CHAR_NAME,local_178,ec);
          UVar1 = ::U_SUCCESS(*ec);
          if (UVar1 == '\0') {
            *ec = U_ILLEGAL_ARGUMENT_ERROR;
          }
          else {
            clear(this);
            add(this,c);
          }
        }
        goto LAB_00395ee9;
      }
      if (UStack_c4 == UCHAR_UNICODE_1_NAME) {
        *ec = U_ILLEGAL_ARGUMENT_ERROR;
        goto LAB_00395ee9;
      }
      if (UStack_c4 != UCHAR_OTHER_PROPERTY_START) {
        *ec = U_ILLEGAL_ARGUMENT_ERROR;
        goto LAB_00395ee9;
      }
      pcVar4 = CharString::data((CharString *)local_b0);
      local_c8 = u_getPropertyValueEnum_63(UCHAR_SCRIPT,pcVar4);
      if (local_c8 == -1) {
        *ec = U_ILLEGAL_ARGUMENT_ERROR;
        goto LAB_00395ee9;
      }
    }
    else {
      pcVar4 = CharString::data((CharString *)local_b0);
      local_c8 = u_getPropertyValueEnum_63(property,pcVar4);
      if (local_c8 == -1) {
        if (((UStack_c4 != UCHAR_CANONICAL_COMBINING_CLASS) &&
            (UStack_c4 != UCHAR_TRAIL_CANONICAL_COMBINING_CLASS)) &&
           (UStack_c4 != UCHAR_LEAD_CANONICAL_COMBINING_CLASS)) {
          *ec = U_ILLEGAL_ARGUMENT_ERROR;
          goto LAB_00395ee9;
        }
        pcVar4 = CharString::data((CharString *)local_b0);
        end_1 = (char *)strtod(pcVar4,(char **)&val);
        if (((*(char *)val == '\0') && (0.0 <= (double)end_1)) && ((double)end_1 <= 255.0)) {
          local_c8 = (int32_t)(double)end_1;
          if (((double)local_c8 == (double)end_1) && (!NAN((double)local_c8) && !NAN((double)end_1))
             ) goto LAB_00395e58;
        }
        *ec = U_ILLEGAL_ARGUMENT_ERROR;
        goto LAB_00395ee9;
      }
    }
  }
LAB_00395e58:
  applyIntPropertyValue(this,UStack_c4,local_c8,ec);
  if (end._7_1_ != '\0') {
    complement(this);
  }
  UVar1 = isBogus(this);
  if ((UVar1 != '\0') && (UVar1 = ::U_SUCCESS(*ec), UVar1 != '\0')) {
    *ec = U_MEMORY_ALLOCATION_ERROR;
  }
LAB_00395ee9:
  v = 1;
  CharString::~CharString((CharString *)local_b0);
  CharString::~CharString((CharString *)&vname.len);
  return this;
}

Assistant:

UnicodeSet&
UnicodeSet::applyPropertyAlias(const UnicodeString& prop,
                               const UnicodeString& value,
                               UErrorCode& ec) {
    if (U_FAILURE(ec) || isFrozen()) return *this;

    // prop and value used to be converted to char * using the default
    // converter instead of the invariant conversion.
    // This should not be necessary because all Unicode property and value
    // names use only invariant characters.
    // If there are any variant characters, then we won't find them anyway.
    // Checking first avoids assertion failures in the conversion.
    if( !uprv_isInvariantUString(prop.getBuffer(), prop.length()) ||
        !uprv_isInvariantUString(value.getBuffer(), value.length())
    ) {
        FAIL(ec);
    }
    CharString pname, vname;
    pname.appendInvariantChars(prop, ec);
    vname.appendInvariantChars(value, ec);
    if (U_FAILURE(ec)) return *this;

    UProperty p;
    int32_t v;
    UBool invert = FALSE;

    if (value.length() > 0) {
        p = u_getPropertyEnum(pname.data());
        if (p == UCHAR_INVALID_CODE) FAIL(ec);

        // Treat gc as gcm
        if (p == UCHAR_GENERAL_CATEGORY) {
            p = UCHAR_GENERAL_CATEGORY_MASK;
        }

        if ((p >= UCHAR_BINARY_START && p < UCHAR_BINARY_LIMIT) ||
            (p >= UCHAR_INT_START && p < UCHAR_INT_LIMIT) ||
            (p >= UCHAR_MASK_START && p < UCHAR_MASK_LIMIT)) {
            v = u_getPropertyValueEnum(p, vname.data());
            if (v == UCHAR_INVALID_CODE) {
                // Handle numeric CCC
                if (p == UCHAR_CANONICAL_COMBINING_CLASS ||
                    p == UCHAR_TRAIL_CANONICAL_COMBINING_CLASS ||
                    p == UCHAR_LEAD_CANONICAL_COMBINING_CLASS) {
                    char* end;
                    double val = uprv_strtod(vname.data(), &end);
                    // Anything between 0 and 255 is valid even if unused.
                    // Cast double->int only after range check.
                    // We catch NaN here because comparing it with both 0 and 255 will be false
                    // (as are all comparisons with NaN).
                    if (*end != 0 || !(0 <= val && val <= 255) ||
                            (v = (int32_t)val) != val) {
                        // non-integral value or outside 0..255, or trailing junk
                        FAIL(ec);
                    }
                } else {
                    FAIL(ec);
                }
            }
        }

        else {

            switch (p) {
            case UCHAR_NUMERIC_VALUE:
                {
                    char* end;
                    double val = uprv_strtod(vname.data(), &end);
                    if (*end != 0) {
                        FAIL(ec);
                    }
                    applyFilter(numericValueFilter, &val,
                                CharacterProperties::getInclusionsForProperty(p, ec), ec);
                    return *this;
                }
            case UCHAR_NAME:
                {
                    // Must munge name, since u_charFromName() does not do
                    // 'loose' matching.
                    char buf[128]; // it suffices that this be > uprv_getMaxCharNameLength
                    if (!mungeCharName(buf, vname.data(), sizeof(buf))) FAIL(ec);
                    UChar32 ch = u_charFromName(U_EXTENDED_CHAR_NAME, buf, &ec);
                    if (U_SUCCESS(ec)) {
                        clear();
                        add(ch);
                        return *this;
                    } else {
                        FAIL(ec);
                    }
                }
            case UCHAR_UNICODE_1_NAME:
                // ICU 49 deprecates the Unicode_1_Name property APIs.
                FAIL(ec);
            case UCHAR_AGE:
                {
                    // Must munge name, since u_versionFromString() does not do
                    // 'loose' matching.
                    char buf[128];
                    if (!mungeCharName(buf, vname.data(), sizeof(buf))) FAIL(ec);
                    UVersionInfo version;
                    u_versionFromString(version, buf);
                    applyFilter(versionFilter, &version,
                                CharacterProperties::getInclusionsForProperty(p, ec), ec);
                    return *this;
                }
            case UCHAR_SCRIPT_EXTENSIONS:
                v = u_getPropertyValueEnum(UCHAR_SCRIPT, vname.data());
                if (v == UCHAR_INVALID_CODE) {
                    FAIL(ec);
                }
                // fall through to calling applyIntPropertyValue()
                break;
            default:
                // p is a non-binary, non-enumerated property that we
                // don't support (yet).
                FAIL(ec);
            }
        }
    }

    else {
        // value is empty.  Interpret as General Category, Script, or
        // Binary property.
        p = UCHAR_GENERAL_CATEGORY_MASK;
        v = u_getPropertyValueEnum(p, pname.data());
        if (v == UCHAR_INVALID_CODE) {
            p = UCHAR_SCRIPT;
            v = u_getPropertyValueEnum(p, pname.data());
            if (v == UCHAR_INVALID_CODE) {
                p = u_getPropertyEnum(pname.data());
                if (p >= UCHAR_BINARY_START && p < UCHAR_BINARY_LIMIT) {
                    v = 1;
                } else if (0 == uprv_comparePropertyNames(ANY, pname.data())) {
                    set(MIN_VALUE, MAX_VALUE);
                    return *this;
                } else if (0 == uprv_comparePropertyNames(ASCII, pname.data())) {
                    set(0, 0x7F);
                    return *this;
                } else if (0 == uprv_comparePropertyNames(ASSIGNED, pname.data())) {
                    // [:Assigned:]=[:^Cn:]
                    p = UCHAR_GENERAL_CATEGORY_MASK;
                    v = U_GC_CN_MASK;
                    invert = TRUE;
                } else {
                    FAIL(ec);
                }
            }
        }
    }

    applyIntPropertyValue(p, v, ec);
    if(invert) {
        complement();
    }

    if (isBogus() && U_SUCCESS(ec)) {
        // We likely ran out of memory. AHHH!
        ec = U_MEMORY_ALLOCATION_ERROR;
    }
    return *this;
}